

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testUVRAII.cxx
# Opt level: O0

int testUVRAII(int param_1,char **param_2)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  char **param_1_local;
  int param_0_local;
  
  bVar1 = testAsyncShutdown();
  bVar4 = false;
  if (bVar1) {
    bVar1 = testAsyncDtor();
    bVar2 = testAsyncMove();
    bVar3 = testCrossAssignment();
    bVar4 = testAllMoves();
    bVar4 = ((bVar1 && bVar2) && bVar3) && bVar4;
  }
  if (bVar4) {
    param_1_local._4_4_ = 0;
  }
  else {
    param_1_local._4_4_ = -1;
  }
  return param_1_local._4_4_;
}

Assistant:

int testUVRAII(int, char** const)
{
  if ((testAsyncShutdown() &&
       testAsyncDtor() & testAsyncMove() & testCrossAssignment() &
         testAllMoves()) == 0) {
    return -1;
  }
  return 0;
}